

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O0

void __thiscall
minibag::Bag::readHeaderFromBuffer
          (Bag *this,Buffer *buffer,uint32_t offset,Header *header,uint32_t *data_size,
          uint32_t *bytes_read)

{
  byte bVar1;
  uint8_t *puVar2;
  BagFormatException *this_00;
  uchar *in_RCX;
  uint in_EDX;
  Buffer *in_RSI;
  undefined4 *in_R8;
  int *in_R9;
  bool parsed;
  string error_msg;
  uint32_t header_len;
  uint8_t *ptr;
  uint8_t *start;
  string *in_stack_ffffffffffffff38;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string local_68 [36];
  uint local_44;
  uint *local_40;
  uint *local_38;
  int *local_30;
  undefined4 *local_28;
  uchar *local_20;
  uint local_14;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  puVar2 = Buffer::getData(in_RSI);
  local_38 = (uint *)(puVar2 + local_14);
  local_44 = *local_38;
  local_40 = local_38 + 1;
  std::__cxx11::string::string(local_68);
  bVar1 = miniros::Header::parse(local_20,(uint)local_40,(string *)(ulong)local_44);
  if ((bVar1 & 1) == 0) {
    this_00 = (BagFormatException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    BagFormatException::BagFormatException(this_00,in_stack_ffffffffffffff38);
    __cxa_throw(this_00,&BagFormatException::typeinfo,BagFormatException::~BagFormatException);
  }
  *local_28 = *(undefined4 *)((long)local_40 + (ulong)local_44);
  local_40 = (uint *)((uint8_t *)((long)local_40 + (ulong)local_44) + 4);
  *local_30 = (int)local_40 - (int)local_38;
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

void Bag::readHeaderFromBuffer(Buffer& buffer, uint32_t offset, miniros::Header& header, uint32_t& data_size, uint32_t& bytes_read) const {
    assert(buffer.getSize() > 8);

    uint8_t* start = (uint8_t*) buffer.getData() + offset;

    uint8_t* ptr = start;

    // Read the header length
    uint32_t header_len;
    memcpy(&header_len, ptr, 4);
    ptr += 4;

    // Parse the header
    string error_msg;
    bool parsed = header.parse(ptr, header_len, error_msg);
    if (!parsed)
        throw BagFormatException("Error parsing header");
    ptr += header_len;

    // Read the data size
    memcpy(&data_size, ptr, 4);
    ptr += 4;

    bytes_read = ptr - start;
}